

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void blkmar_guards(monst *shkp)

{
  level *lev;
  char cVar1;
  int iVar2;
  char *pcVar3;
  monst *mtmp;
  bool bVar4;
  
  if (blkmar_guards_rlock == '\0') {
    blkmar_guards_rlock = 1;
    hot_pursuit(shkp);
    mtmp = (monst *)&level->monlist;
    bVar4 = true;
    lev = level;
    while (mtmp = mtmp->nmon, mtmp != (monst *)0x0) {
      if ((((0 < mtmp->mhp) && (mtmp->mtame == '\0')) &&
          (*(char *)((long)(mtmp->mtrack + 0x18) + (long)mtmp->mxlth) != '\0')) &&
         (((mtmp != shkp && ((*(uint *)&mtmp->field_0x60 & 0x400000) != 0)) &&
          (cVar1 = inside_shop(lev,mtmp->mx,mtmp->my), cVar1 == (char)shkp[0x1b].meating)))) {
        if (bVar4) {
          pcVar3 = noit_Monnam(shkp);
          iVar2 = pronoun_gender(level,shkp);
          pline("%s calls for %s assistants!",pcVar3,genders[iVar2].his);
        }
        wakeup(mtmp);
        bVar4 = false;
        lev = level;
      }
    }
    blkmar_guards_rlock = '\0';
  }
  return;
}

Assistant:

void blkmar_guards(struct monst *shkp)
{
	struct monst *mt;
	struct eshk *eshkp = ESHK(shkp);
	boolean mesg_given = FALSE; /* Only give message if assistants peaceful */
	static boolean rlock = FALSE; /* Prevent recursive calls (via wakeup) */

	if (rlock) return;
	rlock = TRUE;

	/* allow black marketeer to leave his shop */
	hot_pursuit(shkp);

	/* wake up assistants */
	for (mt = level->monlist; mt; mt = mt->nmon) {
	    if (DEADMONSTER(mt)) continue;
	    /* non-tame named monsters are presumably
	     * black marketeer's assistants */
	    if (!mt->mtame && NAME(mt) && *NAME(mt) && mt->mpeaceful &&
		mt != shkp && inside_shop(level, mt->mx, mt->my) == eshkp->shoproom) {
		if (!mesg_given) {
		    pline("%s calls for %s assistants!",
			    noit_Monnam(shkp), mhis(level, shkp));
		    mesg_given = TRUE;
		}
		wakeup(mt);
	    }
	}
	rlock = FALSE;
}